

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall
tinygltf::OrthographicCamera::OrthographicCamera
          (OrthographicCamera *this,OrthographicCamera *param_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = param_1->xmag;
  dVar2 = param_1->ymag;
  dVar3 = param_1->znear;
  this->zfar = param_1->zfar;
  this->znear = dVar3;
  this->xmag = dVar1;
  this->ymag = dVar2;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  Value::Value(&this->extras,&param_1->extras);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

OrthographicCamera() = default;